

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GPUShaderFP64Test2::getShaderStageName(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  switch(shader_stage) {
  case COMPUTE_SHADER:
    this_local = (GPUShaderFP64Test2 *)0x2af422a;
    break;
  case FRAGMENT_SHADER:
    this_local = (GPUShaderFP64Test2 *)0x2af427d;
    break;
  case GEOMETRY_SHADER:
    this_local = (GPUShaderFP64Test2 *)0x2af42a9;
    break;
  case TESS_CTRL_SHADER:
    this_local = (GPUShaderFP64Test2 *)anon_var_dwarf_1f241a;
    break;
  case TESS_EVAL_SHADER:
    this_local = (GPUShaderFP64Test2 *)anon_var_dwarf_1f2427;
    break;
  case VERTEX_SHADER:
    this_local = (GPUShaderFP64Test2 *)0x2af4253;
    break;
  default:
    this_local = (GPUShaderFP64Test2 *)0x0;
  }
  return (GLchar *)this_local;
}

Assistant:

const glw::GLchar* GPUShaderFP64Test2::getShaderStageName(shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case COMPUTE_SHADER:
		return "compute shader";
		break;
	case FRAGMENT_SHADER:
		return "fragment shader";
		break;
	case GEOMETRY_SHADER:
		return "geometry shader";
		break;
	case TESS_CTRL_SHADER:
		return "tesselation control shader";
		break;
	case TESS_EVAL_SHADER:
		return "tesselation evaluation shader";
		break;
	case VERTEX_SHADER:
		return "vertex shader";
		break;
	}

	return 0;
}